

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O2

bool __thiscall
vkt::tessellation::anon_unknown_0::LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_>::
operator()(LexCompare<tcu::Vector<float,_3>,_3,_std::less<float>_> *this,Vector<float,_3> *a,
          Vector<float,_3> *b)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    uVar2 = uVar1;
    if (uVar1 == 3) goto LAB_0070946d;
    if (*(float *)(this + uVar1 * 4) < a->m_data[uVar1]) {
      uVar2 = 1;
      goto LAB_0070946d;
    }
    uVar2 = uVar1 + 1;
  } while (*(float *)(this + uVar1 * 4) <= a->m_data[uVar1]);
  uVar2 = 0;
LAB_0070946d:
  return (bool)(uVar1 < 3 & (byte)uVar2);
}

Assistant:

bool operator() (const SeqT& a, const SeqT& b) const
	{
		for (int i = 0; i < Size; ++i)
		{
			if (m_pred(a[i], b[i]))
				return true;
			if (m_pred(b[i], a[i]))
				return false;
		}
		return false;
	}